

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O0

IfcFloat Assimp::IFC::ConvertSIPrefix(string *prefix)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  format local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *prefix_local;
  
  local_18 = prefix;
  bVar1 = std::operator==(prefix,"EXA");
  if (bVar1) {
    prefix_local = (string *)0x43abc16d60000000;
  }
  else {
    bVar1 = std::operator==(local_18,"PETA");
    if (bVar1) {
      prefix_local = (string *)0x430c6bf520000000;
    }
    else {
      bVar1 = std::operator==(local_18,"TERA");
      if (bVar1) {
        prefix_local = (string *)0x426d1a94a0000000;
      }
      else {
        bVar1 = std::operator==(local_18,"GIGA");
        if (bVar1) {
          prefix_local = (string *)0x41cdcd6500000000;
        }
        else {
          bVar1 = std::operator==(local_18,"MEGA");
          if (bVar1) {
            prefix_local = (string *)0x412e848000000000;
          }
          else {
            bVar1 = std::operator==(local_18,"KILO");
            if (bVar1) {
              prefix_local = (string *)0x408f400000000000;
            }
            else {
              bVar1 = std::operator==(local_18,"HECTO");
              if (bVar1) {
                prefix_local = (string *)0x4059000000000000;
              }
              else {
                bVar1 = std::operator==(local_18,"DECA");
                if (bVar1) {
                  prefix_local = (string *)0x3ff0000000000000;
                }
                else {
                  bVar1 = std::operator==(local_18,"DECI");
                  if (bVar1) {
                    prefix_local = (string *)0x3fb99999a0000000;
                  }
                  else {
                    bVar1 = std::operator==(local_18,"CENTI");
                    if (bVar1) {
                      prefix_local = (string *)0x3f847ae140000000;
                    }
                    else {
                      bVar1 = std::operator==(local_18,"MILLI");
                      if (bVar1) {
                        prefix_local = (string *)0x3f50624de0000000;
                      }
                      else {
                        bVar1 = std::operator==(local_18,"MICRO");
                        if (bVar1) {
                          prefix_local = (string *)0x3eb0c6f7a0000000;
                        }
                        else {
                          bVar1 = std::operator==(local_18,"NANO");
                          if (bVar1) {
                            prefix_local = (string *)0x3e112e0be0000000;
                          }
                          else {
                            bVar1 = std::operator==(local_18,"PICO");
                            if (bVar1) {
                              prefix_local = (string *)0x3d71979980000000;
                            }
                            else {
                              bVar1 = std::operator==(local_18,"FEMTO");
                              if (bVar1) {
                                prefix_local = (string *)0x3cd203afa0000000;
                              }
                              else {
                                bVar1 = std::operator==(local_18,"ATTO");
                                if (bVar1) {
                                  prefix_local = (string *)0x3c32725de0000000;
                                }
                                else {
                                  std::operator+(&local_1b0,"Unrecognized SI prefix: ",local_18);
                                  Formatter::
                                  basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                  ::basic_formatter<std::__cxx11::string>
                                            ((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                              *)&local_190,&local_1b0);
                                  LogFunctions<Assimp::IFCImporter>::LogError(&local_190);
                                  Formatter::
                                  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::~basic_formatter(&local_190);
                                  std::__cxx11::string::~string((string *)&local_1b0);
                                  prefix_local = (string *)0x3ff0000000000000;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (IfcFloat)prefix_local;
}

Assistant:

IfcFloat ConvertSIPrefix(const std::string& prefix)
{
    if (prefix == "EXA") {
        return 1e18f;
    }
    else if (prefix == "PETA") {
        return 1e15f;
    }
    else if (prefix == "TERA") {
        return 1e12f;
    }
    else if (prefix == "GIGA") {
        return 1e9f;
    }
    else if (prefix == "MEGA") {
        return 1e6f;
    }
    else if (prefix == "KILO") {
        return 1e3f;
    }
    else if (prefix == "HECTO") {
        return 1e2f;
    }
    else if (prefix == "DECA") {
        return 1e-0f;
    }
    else if (prefix == "DECI") {
        return 1e-1f;
    }
    else if (prefix == "CENTI") {
        return 1e-2f;
    }
    else if (prefix == "MILLI") {
        return 1e-3f;
    }
    else if (prefix == "MICRO") {
        return 1e-6f;
    }
    else if (prefix == "NANO") {
        return 1e-9f;
    }
    else if (prefix == "PICO") {
        return 1e-12f;
    }
    else if (prefix == "FEMTO") {
        return 1e-15f;
    }
    else if (prefix == "ATTO") {
        return 1e-18f;
    }
    else {
        IFCImporter::LogError("Unrecognized SI prefix: " + prefix);
        return 1;
    }
}